

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid.hpp
# Opt level: O3

void __thiscall Fluid::draw_debug_lines(Fluid *this,mat4 *projection,mat4 *view)

{
  PFNGLUNIFORMMATRIX4FVPROC p_Var1;
  GLint GVar2;
  socklen_t __len;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  int __fd;
  ulong uVar3;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  gfx::Program::use(&this->debug_lines_program);
  p_Var1 = glad_glUniformMatrix4fv;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"projection","");
  GVar2 = (*glad_glGetUniformLocation)((this->debug_lines_program).id,(GLchar *)local_50[0]);
  (*p_Var1)(GVar2,1,'\0',(GLfloat *)projection);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  p_Var1 = glad_glUniformMatrix4fv;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"view","");
  GVar2 = (*glad_glGetUniformLocation)((this->debug_lines_program).id,(GLchar *)local_70[0]);
  __fd = 1;
  (*p_Var1)(GVar2,1,'\0',(GLfloat *)view);
  __len = (socklen_t)view;
  __addr = extraout_RDX;
  if (local_70[0] != local_60) {
    uVar3 = local_60[0] + 1;
    operator_delete(local_70[0],uVar3);
    __fd = (int)uVar3;
    __addr = extraout_RDX_00;
  }
  gfx::VAO::bind(&this->debug_lines_vao,__fd,__addr,__len);
  (*glad_glLineWidth)(4.0);
  (*glad_glDrawArrays)(0,0,(this->debug_lines_ssbo)._length);
  gfx::VAO::unbind(&this->debug_lines_vao);
  (*glad_glUseProgram)(0);
  return;
}

Assistant:

void draw_debug_lines(const glm::mat4& projection, const glm::mat4& view) {
        debug_lines_program.use();
        glUniformMatrix4fv(debug_lines_program.uniform_loc("projection"), 1, GL_FALSE, glm::value_ptr(projection));
        glUniformMatrix4fv(debug_lines_program.uniform_loc("view"), 1, GL_FALSE, glm::value_ptr(view));
        debug_lines_vao.bind();
        glLineWidth(4.0);
        glDrawArrays(GL_POINTS, 0, debug_lines_ssbo.length());
        debug_lines_vao.unbind();
        debug_lines_program.disuse();
    }